

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FieldDescriptorProto::_InternalSerialize
          (FieldDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  FieldOptions *value;
  FieldDescriptorProto *pFVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  FieldDescriptorProto_Label value_00;
  FieldDescriptorProto_Type value_01;
  uint32_t *puVar5;
  char *pcVar6;
  UnknownFieldSet *unknown_fields;
  string_view sVar7;
  string_view local_e8;
  string *local_d8;
  string *_s_4;
  char *local_c8;
  string_view local_c0;
  string *local_b0;
  string *_s_3;
  char *local_a0;
  string_view local_98;
  string *local_88;
  string *_s_2;
  char *local_78;
  string_view local_70;
  string *local_60;
  string *_s_1;
  char *local_50;
  string_view local_48;
  string *local_38;
  string *_s;
  FieldDescriptorProto *pFStack_28;
  uint32_t cached_has_bits;
  FieldDescriptorProto *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FieldDescriptorProto *this_local;
  
  _s._4_4_ = 0;
  pFStack_28 = this;
  this_ = (FieldDescriptorProto *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar5;
  if ((_s._4_4_ & 1) != 0) {
    local_38 = _internal_name_abi_cxx11_(pFStack_28);
    pcVar6 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"google.protobuf.FieldDescriptorProto.name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar6,iVar3,SERIALIZE,local_48);
    pFVar1 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
    local_50 = sVar7._M_str;
    _s_1 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar1,1,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 2) != 0) {
    local_60 = _internal_extendee_abi_cxx11_(pFStack_28);
    pcVar6 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_70,"google.protobuf.FieldDescriptorProto.extendee");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar6,iVar3,SERIALIZE,local_70);
    pFVar1 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    local_78 = sVar7._M_str;
    _s_2 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar1,2,sVar7,(uint8_t *)stream_local);
  }
  pFVar1 = this_;
  if ((_s._4_4_ & 0x40) != 0) {
    iVar4 = _internal_number(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                             ((EpsCopyOutputStream *)pFVar1,iVar4,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x200) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_00 = _internal_label(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(4,value_00,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x400) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_01 = _internal_type(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(5,value_01,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 4) != 0) {
    local_88 = _internal_type_name_abi_cxx11_(pFStack_28);
    pcVar6 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"google.protobuf.FieldDescriptorProto.type_name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar6,iVar3,SERIALIZE,local_98);
    pFVar1 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    local_a0 = sVar7._M_str;
    _s_3 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar1,6,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 8) != 0) {
    local_b0 = _internal_default_value_abi_cxx11_(pFStack_28);
    pcVar6 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_c0,"google.protobuf.FieldDescriptorProto.default_value");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar6,iVar3,SERIALIZE,local_c0);
    pFVar1 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b0);
    local_c8 = sVar7._M_str;
    _s_4 = (string *)sVar7._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar1,7,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x20) != 0) {
    value = (pFStack_28->field_0)._impl_.options_;
    iVar3 = FieldOptions::GetCachedSize((pFStack_28->field_0)._impl_.options_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (8,(MessageLite *)value,iVar3,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  pFVar1 = this_;
  if ((_s._4_4_ & 0x80) != 0) {
    iVar4 = _internal_oneof_index(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteInt32ToArrayWithField<9>
                             ((EpsCopyOutputStream *)pFVar1,iVar4,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x10) != 0) {
    local_d8 = _internal_json_name_abi_cxx11_(pFStack_28);
    pcVar6 = (char *)std::__cxx11::string::data();
    iVar3 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e8,"google.protobuf.FieldDescriptorProto.json_name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar6,iVar3,SERIALIZE,local_e8);
    pFVar1 = this_;
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pFVar1,10,sVar7,(uint8_t *)stream_local);
  }
  if ((_s._4_4_ & 0x100) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    bVar2 = _internal_proto3_optional(pFStack_28);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x11,bVar2,(uint8_t *)stream_local);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(pFStack_28->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pFStack_28->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FieldDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FieldDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // optional string extendee = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_extendee();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.extendee");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional int32 number = 3;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_type(), target);
  }

  // optional string type_name = 6;
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_type_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.type_name");
    target = stream->WriteStringMaybeAliased(6, _s, target);
  }

  // optional string default_value = 7;
  if ((cached_has_bits & 0x00000008u) != 0) {
    const ::std::string& _s = this_._internal_default_value();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.default_value");
    target = stream->WriteStringMaybeAliased(7, _s, target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        8, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // optional int32 oneof_index = 9;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<9>(
            stream, this_._internal_oneof_index(), target);
  }

  // optional string json_name = 10;
  if ((cached_has_bits & 0x00000010u) != 0) {
    const ::std::string& _s = this_._internal_json_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.FieldDescriptorProto.json_name");
    target = stream->WriteStringMaybeAliased(10, _s, target);
  }

  // optional bool proto3_optional = 17;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        17, this_._internal_proto3_optional(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldDescriptorProto)
  return target;
}